

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_signature_map.c
# Opt level: O2

apx_error_t
apx_portSignatureMap_remove
          (apx_portSignatureMap_t *self,char *port_signature,apx_portInstance_t *port_instance)

{
  apx_portType_t aVar1;
  _Bool _Var2;
  apx_error_t aVar3;
  apx_portSignatureMapEntry_t *paVar4;
  
  if (port_signature == (char *)0x0) {
    __assert_fail("port_signature != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map.c"
                  ,0x122,
                  "apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t *, const char *, apx_portInstance_t *)"
                 );
  }
  if (*port_signature != '\0') {
    paVar4 = apx_portSignatureMap_find(self,port_signature);
    if (paVar4 == (apx_portSignatureMapEntry_t *)0x0) {
      aVar3 = 0xc;
    }
    else {
      aVar1 = apx_portInstance_port_type(port_instance);
      if (aVar1 == '\x01') {
        apx_portSignatureMapEntry_detach_provide_port(paVar4,port_instance);
        aVar3 = apx_portSignatureMapEntry_notify_require_ports_about_provide_port_change
                          (paVar4,port_instance,'\x01');
      }
      else {
        apx_portSignatureMapEntry_detach_require_port(paVar4,port_instance);
        aVar3 = apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change
                          (paVar4,port_instance,'\x01');
      }
      _Var2 = apx_portSignatureMapEntry_is_empty(paVar4);
      if (_Var2) {
        paVar4 = (apx_portSignatureMapEntry_t *)adt_hash_remove(&self->internal_map,port_signature);
        if (paVar4 != (apx_portSignatureMapEntry_t *)0x0) {
          apx_portSignatureMapEntry_delete(paVar4);
        }
      }
    }
    return aVar3;
  }
  __assert_fail("strlen(port_signature) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/port_signature_map.c"
                ,0x123,
                "apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t *, const char *, apx_portInstance_t *)"
               );
}

Assistant:

static apx_error_t apx_portSignatureMap_remove(apx_portSignatureMap_t* self, const char* port_signature, apx_portInstance_t* port_instance)
{
   apx_error_t retval = APX_NO_ERROR;
   apx_portSignatureMapEntry_t *entry;
   assert(self != NULL);
   assert(port_signature != NULL);
   assert(strlen(port_signature) > 0);
   assert(port_instance != NULL);
   entry = apx_portSignatureMap_find(self, port_signature);
   if (entry == NULL)
   {
      retval = APX_NOT_FOUND_ERROR;
   }
   else
   {
      if (apx_portInstance_port_type(port_instance) == APX_PROVIDE_PORT)
      {
         apx_portSignatureMapEntry_detach_provide_port(entry, port_instance);
         retval = apx_portSignatureMapEntry_notify_require_ports_about_provide_port_change(entry, port_instance, APX_PORT_DISCONNECTED_EVENT);
      }
      else
      {
         apx_portSignatureMapEntry_detach_require_port(entry, port_instance);
         retval = apx_portSignatureMapEntry_notify_provide_ports_about_require_port_change(entry, port_instance, APX_PORT_DISCONNECTED_EVENT);
      }
      if (apx_portSignatureMapEntry_is_empty(entry))
      {
         apx_portSignatureMap_delete_entry(self, port_signature);
      }
   }
   return retval;
}